

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Minisat::Clause::Clause<Minisat::vec<Minisat::Lit>>
          (Clause *this,vec<Minisat::Lit> *ps,bool use_extra,bool learnt)

{
  Lit *pLVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  uint uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  long lVar6;
  ulong uVar3;
  
  uVar4 = (uint)CONCAT71(in_register_00000009,learnt);
  uVar3 = (ulong)(uVar4 * 4);
  uVar4 = (uint)CONCAT71(in_register_00000011,use_extra) | uVar4;
  uVar5 = (ulong)(uVar4 << 3);
  this->header = (anon_struct_8_10_eb538618_for_header)
                 ((ulong)this->header & 0xffffffffffffffe0 | uVar3 | uVar5);
  uVar2 = ps->sz;
  this->header = (anon_struct_8_10_eb538618_for_header)
                 ((ulong)uVar2 << 0x22 | uVar5 | uVar3 | 0x80000000);
  if (0 < ps->sz) {
    pLVar1 = ps->data;
    lVar6 = 0;
    do {
      *(int *)(&this[1].header.field_0x0 + lVar6 * 4) = pLVar1[lVar6].x;
      lVar6 = lVar6 + 1;
    } while (lVar6 < ps->sz);
  }
  if ((char)uVar4 != '\0') {
    uVar2 = uVar2 & 0x3fffffff;
    uVar3 = (ulong)uVar2;
    if (learnt) {
      *(undefined8 *)(&this[1].header.field_0x0 + uVar3 * 4) = 0;
      return;
    }
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      uVar5 = 0;
      uVar2 = 0;
      do {
        uVar2 = uVar2 | 1 << ((byte)(&this[1].header.field_0x0)[uVar5 * 4] >> 1 & 0x1f);
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    *(uint *)(&this[1].header.field_0x0 + uVar3 * 4) = uVar2;
  }
  return;
}

Assistant:

Clause(const V &ps, bool use_extra, bool learnt)
    {
        header.mark = 0;
        header.learnt = learnt;
        header.has_extra = learnt | use_extra;
        header.reloced = 0;
        header.size = ps.size();
        header.lbd = 0;
        header.S = 0;
        header.removable = 1;
        // simplify
        //
        header.simplified = 0;
        header.onQueue = 0;

        for (int i = 0; i < ps.size(); i++) data[i].lit = ps[i];

        if (header.has_extra) {
            if (header.learnt) {
                data[header.size].act = 0;
                data[header.size + 1].touched = 0;
            } else
                calcAbstraction();
        }
    }